

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pbVar4;
  SpecialProperties SVar5;
  int iVar6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  string *tag_00;
  bool bVar10;
  long lVar11;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  TestCaseInfo info;
  string local_180;
  SourceLineInfo *local_160;
  string local_158;
  TestCase *local_138;
  NameAndTags *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  string local_108;
  ITestInvoker *local_e8;
  string *local_e0;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  sVar2 = (nameAndTags->tags).m_size;
  local_e8 = _testCase;
  local_e0 = _className;
  if (sVar2 != 0) {
    pcVar3 = (nameAndTags->tags).m_start;
    sVar7 = 0;
    bVar10 = false;
    bVar9 = false;
    local_160 = _lineInfo;
    local_138 = __return_storage_ptr__;
    local_130 = nameAndTags;
    do {
      cVar1 = pcVar3[sVar7];
      if (bVar9) {
        tag_00 = &local_180;
        if (cVar1 == ']') {
          SVar5 = anon_unknown_1::parseSpecialTag(tag_00);
          bVar9 = true;
          if (((((SVar5 & IsHidden) == None) && (bVar9 = bVar10, SVar5 == None)) &&
              (SVar5 = anon_unknown_1::parseSpecialTag(&local_180), SVar5 == None)) &&
             ((local_180._M_string_length != 0 &&
              (iVar6 = isalnum((uint)(byte)*local_180._M_dataplus._M_p), iVar6 == 0)))) {
            ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_158);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_158.field_2._M_allocated_capacity,"Tag name: [",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_158.field_2._M_allocated_capacity,local_180._M_dataplus._M_p
                       ,local_180._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_158.field_2._M_allocated_capacity,"] is not allowed.\n",0x12
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_158.field_2._M_allocated_capacity,
                       "Tag names starting with non alphanumeric characters are reserved\n",0x41);
            operator<<((ostream *)local_158.field_2._M_allocated_capacity,local_160);
            std::__cxx11::stringbuf::str();
            throw_domain_error((string *)local_d8);
          }
          bVar10 = bVar9;
          if (((local_180._M_string_length != 0) && (local_180._M_string_length != 1)) &&
             (*local_180._M_dataplus._M_p == 0x2e)) {
            std::__cxx11::string::erase((ulong)&local_180,0);
          }
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_128,&local_180);
          local_180._M_string_length = 0;
          *local_180._M_dataplus._M_p = 0;
          bVar9 = false;
          nameAndTags = local_130;
        }
        else {
LAB_00171a41:
          std::__cxx11::string::push_back((char)tag_00);
        }
      }
      else {
        tag_00 = &local_108;
        if (cVar1 != '[') goto LAB_00171a41;
        bVar9 = true;
      }
      pbVar4 = local_128.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    __return_storage_ptr__ = local_138;
    _lineInfo = local_160;
    if (bVar10) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,".","");
      paVar8 = &local_a8;
      local_b8[0]._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"!hide","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,
                 pbVar4,local_d8,local_98);
      _lineInfo = local_160;
      lVar11 = -0x40;
      do {
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar8->_M_allocated_capacity)[-2],paVar8->_M_allocated_capacity + 1)
          ;
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar8->_M_allocated_capacity + -4);
        lVar11 = lVar11 + 0x20;
        __return_storage_ptr__ = local_138;
        nameAndTags = local_130;
      } while (lVar11 != 0);
    }
  }
  pcVar3 = (nameAndTags->name).m_start;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,pcVar3,pcVar3 + (nameAndTags->name).m_size);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_d8,&local_158,local_e0,&local_108,&local_128,_lineInfo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  TestCase::TestCase(__return_storage_ptr__,local_e8,(TestCaseInfo *)local_d8);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_60);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_p != &local_88) {
    operator_delete(local_98[0]._M_p,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0]._M_p != &local_a8) {
    operator_delete(local_b8[0]._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }